

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geom3d.c
# Opt level: O3

point3d * v3rotate(point3d *p,double theta,point3d *a,point3d *b)

{
  uint uVar1;
  double dVar2;
  double dVar3;
  undefined1 auVar4 [16];
  double dVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  point3d local_b8;
  undefined1 local_98 [80];
  double local_48;
  double local_40;
  double dStack_38;
  double local_30;
  double dStack_28;
  double local_20;
  
  dVar2 = b->z - a->z;
  dVar9 = b->x - a->x;
  dVar11 = b->y - a->y;
  dVar10 = SQRT(dVar2 * dVar2 + dVar9 * dVar9 + dVar11 * dVar11);
  uVar1 = -(uint)(dVar10 != 0.0) & 1;
  auVar6._8_8_ = dVar11;
  auVar6._0_8_ = dVar9;
  auVar7._8_4_ = SUB84(dVar10,0);
  auVar7._0_8_ = dVar10;
  auVar7._12_4_ = (int)((ulong)dVar10 >> 0x20);
  auVar7 = divpd(auVar6,auVar7);
  dVar8 = dVar2 / dVar10;
  if ((dVar10 == 0.0) && (!NAN(dVar10))) {
    dVar8 = dVar2;
  }
  auVar4._0_8_ = CONCAT44((int)(uVar1 << 0x1f) >> 0x1f,(int)(uVar1 << 0x1f) >> 0x1f);
  auVar4._8_4_ = (int)(uVar1 << 0x1f) >> 0x1f;
  auVar4._12_4_ = (int)(uVar1 << 0x1f) >> 0x1f;
  dVar3 = (double)(~auVar4._0_8_ & (ulong)dVar9 | auVar7._0_8_ & auVar4._0_8_);
  dVar5 = (double)(~auVar4._8_8_ & (ulong)dVar11 | auVar7._8_8_ & auVar4._8_8_);
  dVar2 = cos(theta * 0.017453293);
  dVar9 = sin(theta * 0.017453293);
  dVar11 = 1.0 - dVar2;
  local_98._24_8_ = 0.0;
  local_98._56_8_ = 0.0;
  local_40 = 0.0;
  dStack_38 = 0.0;
  local_30 = 0.0;
  dStack_28 = 0.0;
  local_20 = 1.0;
  dVar10 = dVar11 * dVar3;
  local_98._0_8_ = dVar10 * dVar3 + dVar2;
  local_98._8_8_ = dVar10 * dVar5 + dVar9 * dVar8;
  local_98._16_8_ = dVar10 * dVar8 - dVar9 * dVar5;
  dVar10 = dVar5 * dVar11;
  local_98._32_8_ = dVar10 * dVar3 + -(dVar9 * dVar8);
  local_98._40_8_ = dVar10 * dVar5 + dVar2;
  local_98._48_8_ = dVar10 * dVar8 + dVar9 * dVar3;
  dVar11 = dVar11 * dVar8;
  dVar10 = dVar11 * dVar5 + -(dVar9 * dVar3);
  local_98._72_4_ = SUB84(dVar10,0);
  local_98._64_8_ = dVar11 * dVar3 + dVar9 * dVar5;
  local_98._76_4_ = (int)((ulong)dVar10 >> 0x20);
  local_48 = dVar11 * dVar8 + dVar2;
  dVar8 = b->x;
  dVar2 = b->y;
  local_b8.x = p->x - dVar8;
  local_b8.y = p->y - dVar2;
  dVar10 = b->z;
  local_b8.z = p->z - dVar10;
  v3mulPointMat(&local_b8,(matrix4 *)local_98);
  p->x = dVar8 + local_b8.x;
  p->y = dVar2 + local_b8.y;
  p->z = dVar10 + local_b8.z;
  return p;
}

Assistant:

point3d*  v3rotate(point3d* p, double theta, point3d* a, point3d* b) {
	vector3d axis;
	point3d  q;
	matrix4  rotmat;

	v3makeVec(b, a, &axis);
	v3rotationMat(&axis, theta, &rotmat);

	v3sub(p, b, &q);
	v3mulPointMat(&q, &rotmat);
	v3add(&q, b, p);

	return(p);
}